

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall color<unsigned_char,_2U>::normalize(color<unsigned_char,_2U> *this)

{
  vec3<unsigned_char> *in_RDI;
  vec3<unsigned_char> v;
  float local_14;
  float local_10;
  
  vec3<unsigned_char>::vec3(in_RDI,(float)((ulong)&local_14 >> 0x20),SUB84(&local_14,0),0.0);
  vec3<unsigned_char>::normalize(in_RDI);
  *(char *)&(in_RDI->super_vec3_base).r = (char)(int)local_14;
  *(char *)((long)&(in_RDI->super_vec3_base).r + 1) = (char)(int)local_10;
  return;
}

Assistant:

void normalize() {
        vec3<componentType> v((float)r, (float)g,
                              (float)gc_s[sizeof(componentType)] * 0.5f);
        v.normalize();
        r = (componentType)v.r;
        g = (componentType)v.g;
    }